

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

Wvalue NEST::NESTcalc::WorkFunction(double density,double MolarMass,bool OldW13eV)

{
  Wvalue WVar1;
  bool bVar2;
  double eDensity;
  double Wq_eV;
  double alpha;
  bool OldW13eV_local;
  double MolarMass_local;
  double density_local;
  undefined8 local_10;
  
  bVar2 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar2) {
    density_local = 19.26782273603083;
    local_10 = 0.21;
  }
  else {
    local_10 = density * 0.039693 + 0.067366;
    eDensity = (density / MolarMass) * 6.0221409e+23 * 54.0 * -1.01e-23 + 18.7263;
    if (OldW13eV) {
      eDensity = eDensity * 1.1716263232;
    }
    density_local = eDensity;
  }
  WVar1.alpha = local_10;
  WVar1.Wq_eV = density_local;
  return WVar1;
}

Assistant:

NESTcalc::Wvalue NESTcalc::WorkFunction(double density, double MolarMass,
                                        bool OldW13eV) {
  double alpha, Wq_eV;
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    // Liquid argon
    alpha = 0.21;
    Wq_eV = 1000. / 51.9;  // 23.6/1.21; // ~19.2-5 eV
    return Wvalue{.Wq_eV = Wq_eV, .alpha = alpha};
  }
  alpha = 0.067366 + density * 0.039693;
  /*double xi_se = 9./(1.+pow(density/2.,2.));
  double I_ion = 9.+(12.13-9.)/(1.+pow(density/2.953,65.));
  double I_exc = I_ion / 1.46;
  double Wq_eV = I_exc*(alpha/(1.+alpha))+I_ion/(1.+alpha)
  +xi_se/(1.+alpha);*/
  double eDensity = (density / MolarMass) * NEST_AVO * ATOM_NUM;
  Wq_eV = 18.7263 - 1.01e-23 * eDensity;
  if (OldW13eV) Wq_eV *= ZurichEXOW;              // EXO
  return Wvalue{.Wq_eV = Wq_eV, .alpha = alpha};  // W and Nex/Ni together
}